

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O3

uint __thiscall
ON_SubDSectorType::GetSurfaceEvaluationCoefficients
          (ON_SubDSectorType *this,double *LP,size_t LP_capacity,double *L1,size_t L1_capacity,
          double *L2,size_t L2_capacity)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ON_SubDVertexTag OVar4;
  bool bVar5;
  uint i;
  uint N;
  uint uVar6;
  uint uVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  uint i_4;
  double *pdVar16;
  long lVar17;
  uint uVar18;
  double dVar19;
  undefined8 uVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar26;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar36;
  double **local_f8;
  double sin1;
  double local_d0;
  double cos1;
  double *local_c0;
  double *eigenvectors [2];
  double eigenprecision [2];
  double eigenpivots [3];
  ON_Matrix Sbuffer;
  
  dVar19 = SubdominantEigenvalue(this);
  if ((((dVar19 <= 0.0) || (1.0 <= dVar19)) || (N = PointRingCount(this), N < 3)) ||
     (uVar6 = FaceCount(this), uVar6 == 0)) {
LAB_0061fe65:
    ON_SubDIncrementErrorCount();
    return 0;
  }
  uVar12 = (ulong)N;
  if (LP_capacity == 0) {
    LP = (double *)0x0;
  }
  else if (LP == (double *)0x0 || LP_capacity < uVar12) goto LAB_0061fe65;
  if (L1_capacity == 0) {
    if (L2_capacity != 0) goto LAB_0061fe65;
    L1 = (double *)0x0;
    L2 = (double *)0x0;
  }
  else if (((L1 == (double *)0x0 || L1_capacity < uVar12) || (L2_capacity == 0)) ||
          (L2 == (double *)0x0 || L2_capacity < uVar12)) goto LAB_0061fe65;
  OVar4 = VertexTag(this);
  if (3 < OVar4 - 1) goto LAB_0061fe65;
  local_d0 = (double)uVar6;
  switch((uint)OVar4) {
  case 1:
    if ((N & 1) != 0 && 4 < N) {
      if (LP != (double *)0x0) {
        *LP = local_d0 / (local_d0 + 5.0);
        auVar22._0_8_ = (local_d0 + 5.0) * local_d0;
        auVar22._8_8_ = auVar22._0_8_;
        auVar22 = divpd(_DAT_006d3cf0,auVar22);
        uVar10 = 1;
        do {
          *(undefined1 (*) [16])(LP + uVar10) = auVar22;
          uVar10 = uVar10 + 2;
        } while (uVar10 < uVar12);
      }
      if (L1_capacity == 0) {
        return N;
      }
      if (N != 5) {
        ON_SubDMatrix::EvaluateCosAndSin(2,uVar6,&cos1,&sin1);
        dVar19 = (cos1 + 3.0) * -0.125 + dVar19;
        dVar19 = (dVar19 + dVar19) / (cos1 + 1.0);
        *(undefined4 *)L1 = 0;
        *(undefined4 *)((long)L1 + 4) = 0;
        *(undefined4 *)(L1 + 1) = 0;
        *(undefined4 *)((long)L1 + 0xc) = 0x3ff00000;
        *L2 = 0.0;
        L2[1] = 0.0;
        L1[2] = (cos1 + 1.0) * dVar19;
        L2[2] = (sin1 + 0.0) * dVar19;
        uVar12 = 3;
        do {
          dVar21 = sin1;
          local_d0 = cos1;
          L1[uVar12] = cos1;
          L2[uVar12] = sin1;
          uVar7 = (int)uVar12 + 1;
          ON_SubDMatrix::EvaluateCosAndSin(uVar7,uVar6,&cos1,&sin1);
          L1[uVar7] = (local_d0 + cos1) * dVar19;
          L2[uVar7] = (dVar21 + sin1) * dVar19;
          uVar7 = (int)uVar12 + 2;
          uVar12 = (ulong)uVar7;
        } while (N != uVar7);
        return N;
      }
      *L1 = 0.0;
      L1[1] = 1.0;
      L1[2] = 0.0;
      L1[3] = -1.0;
      L1[4] = 0.0;
      *L2 = 0.0;
      L2[1] = 0.0;
      L2[2] = 1.0;
      L2[3] = 0.0;
      L2[4] = -1.0;
      return 5;
    }
    goto LAB_0061fe65;
  case 2:
    if ((N & 1) != 0) goto LAB_0061fe65;
    *LP = 0.6666666666666666;
    LP[N - 1] = 0.16666666666666666;
    LP[1] = 0.16666666666666666;
    auVar3 = _DAT_0069b170;
    auVar22 = _DAT_0069b120;
    if (N == 3) {
      *L1 = 0.0;
      L1[1] = 1.0;
      L1[N - 1] = -1.0;
      uVar7 = 2;
      uVar12 = 2;
      goto LAB_00620469;
    }
    uVar12 = 5;
    if (5 < N) {
      uVar12 = (ulong)N;
    }
    uVar12 = uVar12 - 4;
    auVar24._8_4_ = (int)uVar12;
    auVar24._0_8_ = uVar12;
    auVar24._12_4_ = (int)(uVar12 >> 0x20);
    auVar25._0_8_ = uVar12 >> 1;
    auVar25._8_8_ = auVar24._8_8_ >> 1;
    lVar13 = 0;
    auVar25 = auVar25 ^ _DAT_0069b120;
    do {
      auVar35._8_4_ = (int)lVar13;
      auVar35._0_8_ = lVar13;
      auVar35._12_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar33 = (auVar35 | auVar3) ^ auVar22;
      bVar5 = auVar25._0_4_ < auVar33._0_4_;
      iVar26 = auVar25._4_4_;
      iVar36 = auVar33._4_4_;
      if ((bool)(~(iVar26 < iVar36 || iVar36 == iVar26 && bVar5) & 1)) {
        LP[2] = 0.0;
      }
      if (iVar26 >= iVar36 && (iVar36 != iVar26 || !bVar5)) {
        LP[4] = 0.0;
      }
      lVar13 = lVar13 + 2;
      LP = LP + 4;
    } while ((uVar12 >> 2) * 2 + 2 != lVar13);
    break;
  case 3:
    if ((N & 1) != 0) goto LAB_0061fe65;
    uVar7 = CornerSectorAngleIndex(this);
    uVar12 = 3;
    if (3 < N) {
      uVar12 = (ulong)N;
    }
    *LP = 1.0;
    auVar3 = _DAT_0069b170;
    auVar22 = _DAT_0069b120;
    uVar12 = uVar12 - 2;
    auVar33._8_4_ = (int)uVar12;
    auVar33._0_8_ = uVar12;
    auVar33._12_4_ = (int)(uVar12 >> 0x20);
    auVar23._0_8_ = uVar12 >> 1;
    auVar23._8_8_ = auVar33._8_8_ >> 1;
    lVar13 = (uVar12 >> 1 & 0xfffffffffffffffe) + 2;
    pdVar16 = LP + 3;
    if (uVar6 == 1 || uVar7 != 0x24) {
      lVar8 = 0;
      auVar23 = auVar23 ^ _DAT_0069b120;
      do {
        auVar34._8_4_ = (int)lVar8;
        auVar34._0_8_ = lVar8;
        auVar34._12_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar33 = (auVar34 | auVar3) ^ auVar22;
        if ((bool)(~(auVar33._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar33._0_4_ ||
                    auVar23._4_4_ < auVar33._4_4_) & 1)) {
          pdVar16[-2] = 0.0;
        }
        if ((auVar33._12_4_ != auVar23._12_4_ || auVar33._8_4_ <= auVar23._8_4_) &&
            auVar33._12_4_ <= auVar23._12_4_) {
          *pdVar16 = 0.0;
        }
        lVar8 = lVar8 + 2;
        pdVar16 = pdVar16 + 4;
      } while (lVar13 != lVar8);
      *L1 = -1.0;
      L1[1] = 1.0;
      L1[N - 1] = 0.0;
      if (uVar7 * 2 < 0x49) {
        dVar19 = 1.0;
      }
      else {
        dVar19 = -1.0;
      }
      *L2 = -dVar19;
      L2[1] = 0.0;
      L2[N - 1] = dVar19;
      if (N == 3) {
        return 3;
      }
      uVar18 = 4;
      if (4 < N) {
        uVar18 = N;
      }
      uVar12 = 2;
      do {
        L1[uVar12] = 0.0;
        L2[uVar12] = 0.0;
        uVar12 = uVar12 + 1;
      } while (uVar18 - 1 != uVar12);
      if ((N != 4 || uVar6 != 1) || uVar7 != 0x24) {
        return N;
      }
      *L2 = -1.0;
      L2[1] = 0.0;
      L2[2] = 1.0;
      L2[3] = 0.0;
      return 4;
    }
    lVar8 = 0;
    auVar23 = auVar23 ^ _DAT_0069b120;
    do {
      auVar32._8_4_ = (int)lVar8;
      auVar32._0_8_ = lVar8;
      auVar32._12_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar33 = (auVar32 | auVar3) ^ auVar22;
      bVar5 = auVar23._0_4_ < auVar33._0_4_;
      iVar26 = auVar23._4_4_;
      iVar36 = auVar33._4_4_;
      if ((bool)(~(iVar26 < iVar36 || iVar36 == iVar26 && bVar5) & 1)) {
        pdVar16[-2] = 0.0;
      }
      if (iVar26 >= iVar36 && (iVar36 != iVar26 || !bVar5)) {
        *pdVar16 = 0.0;
      }
      lVar8 = lVar8 + 2;
      pdVar16 = pdVar16 + 4;
    } while (lVar13 != lVar8);
    break;
  case 4:
    if ((N & 1) == 0) goto LAB_0061fe65;
    ON_Matrix::ON_Matrix(&Sbuffer);
    if (uVar6 < 6) {
      local_c0 = (double *)0x0;
      pdVar16 = (double *)0x0;
      local_f8 = (double **)0x0;
    }
    else {
      bVar5 = ON_Matrix::Create(&Sbuffer,N + 2,N);
      if ((!bVar5) || (uVar7 = GetSubdivisionMatrix(this,Sbuffer.m,uVar12), N != uVar7)) {
        N = 0;
        ON_SubDIncrementErrorCount();
        goto LAB_00620eea;
      }
      pdVar16 = Sbuffer.m[uVar12];
      local_f8 = Sbuffer.m;
      local_c0 = Sbuffer.m[N + 1];
    }
    eigenprecision[0] = 0.0;
    eigenprecision[1] = 0.0;
    eigenpivots[0] = 0.0;
    eigenpivots[1] = 0.0;
    eigenpivots[2] = 0.0;
    eigenvectors[0] = pdVar16;
    eigenvectors[1] = local_c0;
    if (LP != (double *)0x0) {
      switch(uVar6) {
      case 2:
        *LP = 0.25806451612903225;
        LP[1] = 0.3225806451612903;
        LP[2] = 0.04838709677419355;
        LP[3] = 0.3225806451612903;
        LP[4] = 0.04838709677419355;
        goto LAB_00620896;
      case 3:
        *LP = 12.789473684210526;
        uVar20 = 0x3ff86bca1af286bd;
        lVar13 = 0x20;
        uVar27 = 0x4019435e50d79436;
        lVar8 = 0x18;
        uVar28 = 0x3ff0000000000000;
        lVar15 = 0x10;
        uVar29 = 0xd79435e5;
        uVar30 = 0x401b5e50;
        lVar17 = 8;
        break;
      case 4:
        *LP = 25.93103448275862;
        LP[1] = 7.241379310344827;
        uVar20 = 0x4018d3dcb08d3dcb;
        lVar13 = 0x28;
        uVar27 = 0x3ff8469ee58469ee;
        lVar8 = 0x20;
        uVar28 = 0x401611a7b9611a7c;
        lVar15 = 0x18;
        lVar17 = 0x10;
        uVar29 = 0;
        uVar30 = 0x3ff00000;
        break;
      case 5:
        *LP = 43.22276446246834;
        LP[1] = 7.4578211569974675;
        LP[2] = 1.0;
        uVar20 = 0x3ff87d519053b63a;
        lVar13 = 0x30;
        uVar27 = 0x4016e72b46baaf08;
        lVar8 = 0x28;
        uVar28 = 0x3ff7a263c23e3a58;
        lVar15 = 0x20;
        uVar29 = 0xdc7a3b62;
        uVar30 = 0x40145661;
        lVar17 = 0x18;
        break;
      default:
        if (local_f8 == (double **)0x0) goto LAB_00620ec0;
        uVar7 = ON_GetEigenvectors(N,local_f8,true,1.0,1,(double *)0x0,eigenvectors,eigenprecision,
                                   eigenpivots);
        if (uVar7 == 1) {
          if (*pdVar16 <= 0.0 && *pdVar16 != 0.0) {
            uVar10 = 0;
            do {
              pdVar16[uVar10] = -pdVar16[uVar10];
              uVar10 = uVar10 + 1;
            } while (uVar12 != uVar10);
          }
          uVar10 = 0;
          do {
            if (pdVar16[uVar10] <= 0.0 && pdVar16[uVar10] != 0.0) {
              ON_SubDIncrementErrorCount();
              goto LAB_00620ee1;
            }
            uVar10 = uVar10 + 1;
          } while (uVar12 != uVar10);
          *LP = *pdVar16;
          LP[1] = pdVar16[1];
          uVar7 = N - 1;
          if (1 < uVar7) {
            uVar18 = 3;
            do {
              dVar19 = pdVar16[uVar18 - 1];
              uVar10 = -(ulong)(pdVar16[uVar7] == dVar19);
              LP[uVar18 - 1] =
                   (double)(uVar10 & (ulong)dVar19 |
                           ~uVar10 & (ulong)((dVar19 + pdVar16[uVar7]) * 0.5));
              uVar7 = uVar7 - 1;
              bVar5 = uVar18 <= uVar7;
              uVar18 = uVar18 + 1;
            } while (bVar5);
          }
          if (uVar6 < 3) goto LAB_00620896;
          goto LAB_0062082a;
        }
        ON_SubDIncrementErrorCount();
        goto LAB_00620ee1;
      }
      *(ulong *)((long)LP + lVar17) = CONCAT44(uVar30,uVar29);
      *(undefined8 *)((long)LP + lVar15) = uVar28;
      *(undefined8 *)((long)LP + lVar8) = uVar27;
      *(undefined8 *)((long)LP + lVar13) = uVar20;
LAB_0062082a:
      if (2 < N - 1) {
        pdVar9 = LP + (N - 1);
        pdVar14 = LP + 3;
        do {
          *pdVar9 = pdVar14[-1];
          pdVar9 = pdVar9 + -1;
          bVar5 = pdVar14 < pdVar9;
          pdVar14 = pdVar14 + 1;
        } while (bVar5);
      }
      dVar19 = 0.0;
      uVar10 = 0;
      do {
        dVar19 = dVar19 + LP[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      uVar10 = 0;
      do {
        LP[uVar10] = LP[uVar10] / dVar19;
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
    }
LAB_00620896:
    if (L1_capacity != 0) {
      switch(uVar6) {
      case 2:
        *L1 = 0.0;
        L1[1] = 0.0;
        L1[2] = -1.0;
        L1[3] = 0.0;
        L1[4] = 1.0;
        *L2 = 4.0;
        lVar13 = 0x20;
        uVar20 = 0xc020000000000000;
        lVar8 = 0x18;
        uVar28 = 0xbff0000000000000;
        lVar15 = 0x10;
        uVar6 = 0x40180000;
        lVar17 = 8;
        uVar27 = 0xbff0000000000000;
        break;
      case 3:
        *L1 = -2.25;
        L1[1] = -3.0;
        L1[2] = 0.5;
        L1[3] = 3.0;
        L1[4] = 0.75;
        L1[5] = 1.0;
        L1[6] = 0.0;
        *L2 = 9.0;
        L2[1] = 12.0;
        L2[2] = -3.0;
        uVar27 = 0x3ff0000000000000;
        lVar13 = 0x30;
        uVar20 = 0;
        lVar8 = 0x28;
        uVar28 = 0xc008000000000000;
        lVar15 = 0x20;
        uVar6 = 0xc0300000;
        lVar17 = 0x18;
        break;
      case 4:
        *L1 = -4.0;
        L1[1] = -7.0;
        L1[2] = 0.5;
        L1[3] = 3.0;
        L1[4] = 1.5;
        L1[5] = 4.0;
        L1[6] = 1.0;
        L1[7] = 1.0;
        L1[8] = 0.0;
        *L2 = 16.0;
        L2[1] = 28.0;
        L2[2] = -3.0;
        L2[3] = -16.0;
        L2[4] = -7.0;
        uVar27 = 0x3ff0000000000000;
        lVar13 = 0x40;
        uVar20 = 0;
        lVar8 = 0x38;
        uVar28 = 0xc008000000000000;
        lVar15 = 0x30;
        uVar6 = 0xc0300000;
        lVar17 = 0x28;
        break;
      case 5:
        *L1 = -6.25;
        L1[1] = -14.20820393249937;
        L1[2] = 0.5;
        L1[3] = 3.0;
        L1[4] = 1.9635254915624212;
        L1[5] = 5.854101966249685;
        L1[6] = 2.368033988749895;
        L1[7] = 4.618033988749895;
        L1[8] = 1.1545084971874737;
        L1[9] = 1.0;
        L1[10] = 0.0;
        *L2 = 25.0;
        L2[1] = 56.83281572999748;
        L2[2] = -3.0;
        L2[3] = -16.0;
        L2[4] = -9.47213595499958;
        L2[5] = -25.88854381999832;
        L2[6] = -9.47213595499958;
        uVar27 = 0x3ff0000000000000;
        lVar13 = 0x50;
        uVar20 = 0;
        lVar8 = 0x48;
        uVar28 = 0xc008000000000000;
        lVar15 = 0x40;
        uVar6 = 0xc0300000;
        lVar17 = 0x38;
        break;
      default:
        if (local_f8 == (double **)0x0) {
LAB_00620ec0:
          ON_SubDIncrementErrorCount();
        }
        else {
          dVar19 = SubdominantEigenvalue(this);
          if ((dVar19 <= 0.0) || (1.0 <= dVar19)) {
            ON_SubDIncrementErrorCount();
          }
          else {
            uVar7 = ON_GetEigenvectors(N,local_f8,true,dVar19,2,(double *)0x0,eigenvectors,
                                       eigenprecision,eigenpivots);
            if (uVar7 == 2) {
              uVar18 = N - 2;
              dVar19 = pdVar16[uVar18];
              dVar21 = local_c0[uVar18];
              uVar7 = N - 1;
              dVar1 = pdVar16[uVar7];
              dVar2 = local_c0[uVar7];
              dVar31 = dVar19 * dVar2 - dVar1 * dVar21;
              if ((dVar31 != 0.0) || (NAN(dVar31))) {
                uVar10 = 0;
                do {
                  L1[uVar10] = pdVar16[uVar10] * (dVar2 / dVar31) +
                               local_c0[uVar10] *
                               (double)(~-(ulong)(dVar1 == -dVar1) & (ulong)(-dVar1 / dVar31));
                  L2[uVar10] = pdVar16[uVar10] *
                               (double)(~-(ulong)(dVar21 == 0.0) & (ulong)(-dVar21 / dVar31)) +
                               local_c0[uVar10] * (dVar19 / dVar31);
                  uVar10 = uVar10 + 1;
                } while (uVar12 != uVar10);
                uVar10 = 0;
                do {
                  dVar19 = L1[uVar10];
                  dVar21 = floor(dVar19 + 0.49);
                  if (ABS(dVar21 - dVar19) <= 1e-12) {
                    L1[uVar10] = dVar21;
                  }
                  dVar19 = L2[uVar10];
                  dVar21 = floor(dVar19 + 0.49);
                  if (ABS(dVar21 - dVar19) <= 1e-12) {
                    L2[uVar10] = dVar21;
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar12 != uVar10);
                *L1 = local_d0 * -0.25 * local_d0;
                L1[uVar18] = 1.0;
                L1[uVar7] = 0.0;
                *L2 = (double)(uVar6 * uVar6);
                L2[2] = -3.0;
                L2[3] = -16.0;
                L2[N - 4] = -16.0;
                L2[N - 3] = -3.0;
                L2[uVar18] = 0.0;
                L2[uVar7] = 1.0;
                if (4 < N - 5) {
                  uVar10 = 4;
                  uVar12 = (ulong)(N - 5);
                  do {
                    uVar11 = uVar12 - 1;
                    dVar19 = L2[uVar10];
                    dVar21 = L2[uVar12];
                    if ((dVar19 != dVar21) || (NAN(dVar19) || NAN(dVar21))) {
                      dVar19 = (dVar19 + dVar21) * 0.5;
                      L2[uVar10] = dVar19;
                      L2[uVar12] = dVar19;
                    }
                    uVar10 = uVar10 + 1;
                    uVar12 = uVar11;
                  } while (uVar10 < (uVar11 & 0xffffffff));
                }
                goto LAB_00620eea;
              }
            }
            else {
              ON_SubDIncrementErrorCount();
            }
          }
        }
LAB_00620ee1:
        N = 0;
        goto LAB_00620eea;
      }
      *(ulong *)((long)L2 + lVar17) = (ulong)uVar6 << 0x20;
      *(undefined8 *)((long)L2 + lVar15) = uVar28;
      *(undefined8 *)((long)L2 + lVar8) = uVar20;
      *(undefined8 *)((long)L2 + lVar13) = uVar27;
    }
LAB_00620eea:
    ON_Matrix::~ON_Matrix(&Sbuffer);
    return N;
  }
  *L1 = 0.0;
  L1[1] = 1.0;
  uVar7 = N - 1;
  uVar12 = (ulong)uVar7;
  L1[uVar12] = -1.0;
  if (N == 3) {
    uVar7 = 2;
    uVar12 = 2;
  }
  else {
    uVar18 = 4;
    if (4 < N) {
      uVar18 = N;
    }
    memset(L1 + 2,0,(ulong)(uVar18 - 3) << 3);
  }
LAB_00620469:
  if (uVar6 == 1) {
    *L2 = -2.0;
    L2[1] = 1.0;
    L2[2] = 0.0;
    L2[3] = 1.0;
    return N;
  }
  ON_SubDMatrix::EvaluateCosAndSin(1,uVar6,&cos1,&sin1);
  *L2 = -sin1;
  dVar19 = (cos1 + cos1 + 1.0) * ((cos1 + 1.0) / sin1) * -0.25;
  L2[1] = dVar19;
  L2[2] = (sin1 + 0.0) * 0.25;
  L2[uVar12] = dVar19;
  uVar18 = 3;
  do {
    dVar19 = sin1;
    ON_SubDMatrix::EvaluateCosAndSin((uVar18 >> 1) + 1,uVar6,&cos1,&sin1);
    L2[uVar18] = dVar19;
    L2[uVar18 + 1] = (dVar19 + sin1) * 0.25;
    uVar18 = uVar18 + 2;
  } while (uVar18 < uVar7);
  return N;
}

Assistant:

unsigned int ON_SubDSectorType::GetSurfaceEvaluationCoefficients(
  double* LP,
  size_t LP_capacity,
  double* L1,
  size_t L1_capacity,
  double* L2,
  size_t L2_capacity
  ) const
{
  const double lambda = SubdominantEigenvalue();
  if (!(lambda > 0.0 && lambda < 1.0))
    return ON_SUBD_RETURN_ERROR(0);

  
  const unsigned int R = PointRingCount();
  if (R < 3)
    return ON_SUBD_RETURN_ERROR(0);

  const unsigned int F = FaceCount();
  if (F < 1)
    return ON_SUBD_RETURN_ERROR(0);
  const double dF = F;

  if ( 0 == LP_capacity)
    LP = nullptr;
  else if (LP_capacity < R || nullptr == LP)
  {
    return ON_SUBD_RETURN_ERROR(0);
  }

  if ( 0 == L1_capacity)
    L1 = nullptr;
  else if (L1_capacity < R || nullptr == L1)
  {
    return ON_SUBD_RETURN_ERROR(0);
  }

  if ( 0 == L2_capacity)
    L2 = nullptr;
  else if (L2_capacity < R || nullptr == L2)
  {
    return ON_SUBD_RETURN_ERROR(0);
  }

  if (nullptr == L1 || nullptr == L2)
  {
    // If one of L1 or L2 is null, then both must be null.
    if (nullptr != L1 || nullptr != L2)
    {
      return ON_SUBD_RETURN_ERROR(0);
    }
  }

  double p, q, y, z, cos0, cos1, sin0, sin1;
  bool b180degreeCorner = false;

  switch (VertexTag())
  {
  case ON_SubDVertexTag::Unset:
    break;

  case ON_SubDVertexTag::Smooth:
    if (R >= 5 && 1 == (R % 2))
    {
      if (nullptr != LP)
      {
        // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Smooth
        //
        // General case code works for R = 5 case: LP[5] = {2/7, 2/7, 1/14, 2/7, 1/14};
        LP[0] = dF / (5.0 + dF); // center point coefficient
        y = dF * (dF + 5.0);
        p = 4.0 / y; // edge point coefficient
        q = 1.0 / y; // face point coefficient
        for (unsigned int i = 1; i < R; i++)
        {
          LP[i] = p;
          i++;
          LP[i] = q;
        }
      }

      if (nullptr != L1)
      {
        if (5 == R)
        {
          // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Smooth
          //
          // Evaluation matrix has eigenvalues 1, 1/4, 1/4, -1/4, 1/8,
          // so we have a well defined limit point and 3 subdominant eigenvalues. 
          // The 1 eigenspace is 1 dimensional and spanned by (1,1,1,1,1).
          // The 1/4 eigenspace is 2 dimensional and spanned by (0,1,0,-1,0) and (0,0,1,0,-1).
          // The -1/4 eigenspace is 1 dimensional and spanned by (2,-1,0,-1,0).
          // The 1/8 is 1 dimensional and spanned by (1,1,-6,1,-6).
          // The general case code below will divide by zero when y is evaluated because cos1 = -1.
          // Turns out there is 1 well defined tangent vector (Q1-Q0) (quad points)

          // This is a "pseudo" limit tangent
          L1[0] = 0.0;
          L1[1] = 1.0;
          L1[2] = 0.0;
          L1[3] = -1.0;
          L1[4] = 0.0;

          // This is a bonafide limit tangent
          L2[0] = 0.0;
          L2[1] = 0.0;
          L2[2] = 1.0;
          L2[3] = 0.0;
          L2[4] = -1.0;
        }
        else
        {
          // cos0 = cos(2pi * 0/F)
          // sin0 = sin(2pi * 0/F)
          // cos1 = cos(2pi * 1/F)
          // sin1 = sin(2pi * 1/F)
          cos0 = 1.0;
          sin0 = 0.0;
          ON_SubDMatrix::EvaluateCosAndSin(2, F, &cos1, &sin1);
          y = 2.0* (lambda - 0.125*(3.0 + cos1)) / (1.0 + cos1);
          L1[0] = 0.0;
          L1[1] = cos0;
          L2[0] = 0.0;
          L2[1] = sin0;
          unsigned int i = 2;
          for (;;)
          {
            L1[i] = y * (cos0 + cos1);
            L2[i] = y * (sin0 + sin1);
            i++;
            if (i == R)
              break;
            L1[i] = cos1;
            L2[i] = sin1;
            i++;
            cos0 = cos1;
            sin0 = sin1;
            ON_SubDMatrix::EvaluateCosAndSin(i, F, &cos1, &sin1);
            // E0[] and E1[] values are symmetric and we could stop halfway and copy
            // current loop debugged and tested Feb 10, 2015
          }
        }
      }
      return R;
    }
    break;

  case ON_SubDVertexTag::Dart:
    if (1 == (R % 2))
    {
      ON_Matrix Sbuffer;
      const double*const* S = nullptr;
      double* E1 = nullptr;
      double* E2 = nullptr;
      if (F > 5)
      {
        if (false == Sbuffer.Create(R+2,R))
          return ON_SUBD_RETURN_ERROR(0);
        if (R != ON_SubDSectorType::GetSubdivisionMatrix(Sbuffer.m, R))
          return ON_SUBD_RETURN_ERROR(0);
        S = Sbuffer.m;
        E1 = Sbuffer.m[R];
        E2 = Sbuffer.m[R+1];
      }
      const double* termination_tolerances = nullptr;
      double* eigenvectors[2] = { E1, E2 };
      double eigenprecision[2] = { 0 };
      double eigenpivots[3] = { 0 };

      if (nullptr != LP)
      {
        switch (F)
        {
        case 2:
          // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Dart
          //
          // Evaluation matrix is 5x5 with has eigenvalues 1, 1/2, 1/4, sqrt(2)/8, - sqrt(2)/8.
          LP[0] = 8.0 / 31.0;
          LP[1] = 10.0 / 31.0;
          LP[2] = 3.0 / 62.0;
          LP[3] = 10.0 / 31.0;
          LP[4] = 3.0 / 62.0;
          break;

        case 3:
          LP[0] = 243/19.0;
          LP[1] = 130/19.0;
          LP[2] = 1.0;
          LP[3] = 120/19.0;
          LP[4] = 29/19.0;
          //LP[5] = 120/19.0;
          //LP[6] = 1.0;
          break;
        case 4:
          LP[0] = 752/29.0;
          LP[1] = 210/29.0;
          LP[2] = 1.0;
          LP[3] = 160/29.0;
          LP[4] = 44/29.0;
          LP[5] = 180/29.0; 
          //LP[6] = 44/29.0;
          //LP[7] = 160/29.0;
          //LP[8] = 1.0;
          break;
        case 5:
          LP[0] = 43.222764462468341719; 
          LP[1] = 7.4578211569974673376; 
          LP[2] = 1.0;
          LP[3] = 5.0843576860050653249; 
          LP[4] = 1.4771459186191773181; 
          LP[5] = 5.7257510234301278178;
          LP[6] = 1.5305953634045991926;
          //LP[7] = 5.7257510234301278178; 
          //LP[8] = 1.4771459186191773181;
          //LP[9] = 5.0843576860050653249;
          //LP[10] = 1.0000000000000000000;
          break;
        default:
          {
            // TODO
            // Finish general case formula for dominant eigenvector of Transpose(S)
            // Until I derive the formula, I can get the dominant eigenvector as the kernel of the matrix (S - I).
            // This calculation has plenty of precision, but it's a less elegant way to get the solution.
            if (nullptr == S)
              return ON_SUBD_RETURN_ERROR(0);
            const double lambda_local = 1.0;
            const unsigned int lambda_multiplicity = 1;
            if (lambda_multiplicity != ON_GetEigenvectors(R, S, true, lambda_local, lambda_multiplicity, termination_tolerances, eigenvectors, eigenprecision, eigenpivots))
              return ON_SUBD_RETURN_ERROR(0);
            if (E1[0] < 0.0)
            {
              for ( unsigned int i = 0; i < R; i++ )
                E1[i] = -E1[i];
            }
            for (unsigned int i = 0; i < R; i++)
            {
              if (E1[i] < 0.0)
                return ON_SUBD_RETURN_ERROR(0);
            }
            LP[0] = E1[0];
            LP[1] = E1[1];
            unsigned int i0 = 2;
            unsigned int i1 = R-1;
            while (i0 <= i1)
            {
              LP[i0] = (E1[i0] == E1[i1]) ? E1[i0] : 0.5*(E1[i0] + E1[i1]);
              i0++;
              i1--;
            }
          }
          break;
        }

        if (F >= 3)
        {
          // The code below works for all F >= 3.
          const double* q0 = &LP[2];
          double* q1 = &LP[R - 1];
          while (q0 < q1)
            *q1-- = *q0++;
          double LPsum = 0.0;
          for (unsigned int i = 0; i < R; i++)
            LPsum += LP[i];
          for (unsigned int i = 0; i < R; i++)
            LP[i] /= LPsum;
        }
      }

      if (nullptr != L1)
      {
        switch (F)
        {
        case 2:
          // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Dart
          //
          // Evaluation matrix is 5x5 with has eigenvalues 1, 1/2, 1/4, sqrt(2)/8, - sqrt(2)/8.
          // The multiplicity of the subdominant eigen value is 1/2 and there is a single well defined
          // tangent in the limit surface. The other is a "fake" tangent that is close enough.

          // This is pseudo tangent associated with the eigenvalue 1/4
          // (1/4)^n goes to zero much faster than (1/2)^n, but ...
          // If the 5 points were translated so the limit point was zero 
          // and then a rotation about the origin were applied so bonafide limit tangent
          // was parallel to the x-axis (L2*(C,P0,Q0,P1,P1) = 0), then, as n goes to infinity,
          // Q0 - Q1 would be the farthest point from the x-axis.
          // the 5 
          L1[0] = 0.0;
          L1[1] = 0.0;
          L1[2] = -1.0;
          L1[3] = 0.0;
          L1[4] = 1.0;

          // This is a bonafide limit tangent associated with the eigenvalue 1/2.
          // I
          L2[0] = 4.0; // 2^2
          L2[1] = 6.0; 
          L2[2] = -1.0; 
          L2[3] = -8.0;
          L2[4] = -1.0;
          break;

        case 3:
          L1[0] = -9/4.0; // -L2[0]/4
          L1[1] = -3.0;
          L1[2] = 1/2.0;
          L1[3] = 3.0; 
          L1[4] = 3/4.0;
          L1[5] = 1;
          L1[6] = 0;

          L2[0] = 9.0; // 3^2
          L2[1] = 12.0; 
          L2[2] =  -3; 
          L2[3] = -16;  // -16  // -3, -16 = L2[3] = -16, -3
          L2[4] =  -3;  //  -3
          L2[5] = 0; 
          L2[6] = 1;
          break;

        case 4:
          L1[0] = -4.0;  // -L2[0]/4
          L1[1] = -7.0; 
          L1[2] = 1/2.0; 
          L1[3] = 3.0; 
          L1[4] = 3/2.0; 
          L1[5] = 4.0; 
          L1[6] = 1.0; 
          L1[7] = 1; 
          L1[8] = 0;

          L2[0] = 16.0; // 4^2
          L2[1] = 28.0;
          L2[2] =  -3;
          L2[3] = -16;
          L2[4] = -7.0;   // -3, -16, L2[4], -16, -3
          L2[5] = -16; 
          L2[6] =  -3;
          L2[7] = 0;
          L2[8] = 1;
          break;

        case 5:
          L1[0] = -6.25; // -L2[0]/4
          L1[1] = -14.208203932499369089;
          L1[2] = 0.50000000000000000000;
          L1[3] = 3.0000000000000000000;
          L1[4] = 1.9635254915624211362;
          L1[5] = 5.8541019662496845446;
          L1[6] = 2.3680339887498948482; 
          L1[7] = 4.6180339887498948482;
          L1[8] = 1.1545084971874737121;
          L1[9]  = 1;
          L1[10] = 0;

          L2[0] = 25.0; // 5^2
          L2[1] = 56.832815729997476357;
          L2[2] =  -3;
          L2[3] = -16;
          L2[4] = -9.4721359549995793928;
          L2[5] = -25.888543819998317571; // -3, -16, ..., L2[5], ..., -16, -3
          L2[6] = -9.4721359549995793928;
          L2[7] = -16; // -16 
          L2[8] =  -3; //  -3
          L2[9]  = 0;
          L2[10] = 1;
          break;

        default:
          {
            // TODO
            // Finish general case formula for subdominant eigenvectors of Transpose(S)
            // Until I derive the formula, I can get the subdominant eigenvectors as the kernel of the matrix (S - 1/2*I).
            // This calculation has plenty of precision, but it's a less elegant way to get the solution.
            if (nullptr == S)
              return ON_SUBD_RETURN_ERROR(0);
            const double lambda_local = SubdominantEigenvalue();
            if (!(lambda_local > 0.0 && lambda_local < 1.0))
              return ON_SUBD_RETURN_ERROR(0);
            const unsigned int lambda_multiplicity = 2;
            if (lambda_multiplicity != ON_GetEigenvectors(R, S, true, lambda_local, lambda_multiplicity, termination_tolerances, eigenvectors, eigenprecision, eigenpivots))
              return ON_SUBD_RETURN_ERROR(0);

            const double E[2][2] = { { E1[R - 2], E2[R - 2] }, { E1[R - 1], E2[R - 1] } };

            const double det = E[0][0] * E[1][1] - E[0][1] * E[1][0];
            if (!(0.0 != det))
              return 0;

            const double EtoL[2][2] = {
              { E[1][1] / det, (0.0 == E[0][1]) ? 0.0 : (-E[0][1] / det) },
              { (0.0 == E[1][0]) ? 0.0 : (-E[1][0] / det), E[0][0] / det } };

            for (unsigned int i = 0; i < R; i++)
            {
              L1[i] = E1[i] * EtoL[0][0] + E2[i] * EtoL[1][0];
              L2[i] = E1[i] * EtoL[0][1] + E2[i] * EtoL[1][1];
            }

            const double int_tol = 1e-12;
            double x;
            for (unsigned int i = 0; i < R; i++)
            {
              x = floor(L1[i]+0.49);
              if (fabs(x - L1[i]) <= int_tol)
                L1[i] = x;
              x = floor(L2[i]+0.49);
              if (fabs(x - L2[i]) <= int_tol)
                L2[i] = x;
            }

            L1[0]     = -0.25*F*F;
            L1[R - 2] = 1.0;
            L1[R - 1] = 0.0;

            L2[0]   = F*F;
            L2[2]   = -3.0;
            L2[3]   = -16.0;
            L2[R-4] = -16.0;
            L2[R-3] =  -3.0;
            L2[R-2] =   0.0;
            L2[R-1] =   1.0;

            // L2[2, ..., R-1] is symmetric about L2[2+R/2]
            unsigned int i0 = 4;
            unsigned int i1 = R - 5;
            while (i0 < i1)
            {
              if (L2[i0] != L2[i1])
              {
                x = 0.5*(L2[i0] + L2[i1]);
                L2[i0] = x;
                L2[i1] = x;
              }
              i0++;
              i1--;
            }
          }
          break;
        }
      }
      return R;
    }
    break;


  case ON_SubDVertexTag::Corner:
    if (0 == (R % 2))
    {
      const unsigned int angle_index = CornerSectorAngleIndex();
      if ( 36 == angle_index && F > 1)
        b180degreeCorner = true; // use crease calculation
      else
      {
        // the corner angle alpha is not equal to pi (180 degrees)
        // so limit tangents will not be parallel
        // Lpev[]
        LP[0] = 1.0; // center point coefficient
        for (unsigned int i = 1; i < R; i++)
          LP[i++] = 0.0; // all face and edge coefficients = 0

        L1[0] = -1.0; // center point coefficient
        L1[1] = 1.0; // initial boundary edge point coefficient
        L1[R - 1] = 0.0; // final boundary edge point coefficient

        // The sign of s is selected to keep the normal pointing "up".
        double s = (2 * angle_index <= ON_SubDSectorType::MaximumCornerAngleIndex) ? 1.0 : -1.0;
        L2[0] = -s; // center point coefficient
        L2[1] = 0.0; // initial boundary edge point coefficient
        L2[R - 1] = s; // final boundary edge point coefficient
        for (unsigned int i = 2; i + 1 < R; i++)
        {
          L1[i] = 0.0; // all face and interior edge coefficients = 0
          L2[i] = 0.0; // all face and interior edge coefficients = 0
        }

        if (36 == angle_index && 1 == F && 4 == R)
        {
          // This case has no good solution.
          L2[0] = -1.0;
          L2[1] = 0.0;
          L2[2] = 1.0;
          L2[3] = 0.0;
        }

        // TODO deal with 180 degree "corner case".  
        // L0 and L1 are the same as above. L2 will be similar to the crease case
        return R;
      }
    }
    if ( false == b180degreeCorner)
      break;

  case ON_SubDVertexTag::Crease:
    // NOTE: In the case when there are 2 crease edes and a single face,
    // The Catmull-Clark subdivision matrix is singular.
    if (0 == (R % 2))
    {
      // Lpev[]
      if (b180degreeCorner)
      {
        LP[0] = 1.0; // center point coefficient
        for (unsigned int i = 1; i < R; i++)
          LP[i++] = 0.0; // all face and edge coefficients = 0
      }
      else
      {
        LP[0] = 2.0 / 3.0; // center point coefficient
        LP[1] = LP[R - 1] = 1.0 / 6.0;  // boundary edge point coefficients
        for (unsigned int i = 2; i + 1 < R; i++)
          LP[i++] = 0.0; // all face and interior edge coefficients = 0
      }

      // Using L1[] computes the tangent to the crease curve. This
      // curve is a uniform cubic spline with control points
      // (..., final crease edge point, center point, initial crease edge point, ...)
      L1[  0] =  0.0; // center point coefficient
      L1[  1] =  1.0; // initial boundary edge point coefficient
      L1[R-1] = -1.0; // final boundary edge point coefficient
      for (unsigned int i = 2; i+1 < R; i++)
        L1[i] = 0.0; // all face and interior edge coefficients = 0

      // Using L2[] computes a tangent that points from the limit point
      // into the subdivision surface.
      if (1 == F)
      {
        // This is the special where IsCatmullClarkCreaseOneFaceCase() returns true.
        // Catmull-Clark subdivision,
        // center vertex is a crease vertex,
        // one face and two crease edges.
        L2[0] = -2.0; // center point coefficients
        L2[1] =  1.0; // boundary edge point coefficient
        L2[2] =  0.0; // face point coefficient
        L2[3] =  1.0; // boundary edge point coefficient
      }
      else
      {
        // F faces, F-1 interior smooth edges and 2 boundary edges
        // theta = pi/F
        cos0 = 1.0; // cos(0)
        sin0 = 0.0; // sin(0)
        ON_SubDMatrix::EvaluateCosAndSin(1,F,&cos1,&sin1); // cos1 = cos(pi/F), sin1 = sin(pi/F)
        z = (1.0 + cos1) / sin1;
        L2[0] = -sin1;  // center point coefficients
        L2[1] = -0.25*z*(1.0 + 2.0*cos1); // initial boundary edge point coefficient
        L2[2] = 0.25*(sin0 + sin1); // first interior face point coefficient
        L2[R-1] = L2[1];            // final boundary edge point coefficient
        unsigned int i = 3;
        for (;;)
        {
          cos0 = cos1;
          sin0 = sin1;
          ON_SubDMatrix::EvaluateCosAndSin(i/2 + 1, F, &cos1, &sin1);
          L2[i] = sin0; // interior edge point coefficient
          i++;
          L2[i] = 0.25*(sin0 + sin1); // interior face point coefficient
          i++;
          if ( i >= R-1 )
            break;
        }
      }

      return R;
    }
    break;
  }

  return ON_SUBD_RETURN_ERROR(0);
}